

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  REF_CELL *ppRVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  uint cell;
  REF_DBL volume;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ppRVar3 = ref_grid->cell + 3;
  if (ref_grid->twod == 0) {
    ppRVar3 = ref_grid->cell + 8;
  }
  ref_cell = *ppRVar3;
  cell = 0;
  do {
    if (ref_cell->max <= (int)cell) {
      return 0;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar1 == 0) {
      if (ref_grid->twod == 0) {
        uVar2 = ref_node_tet_vol(ref_node,nodes,&volume);
        if (uVar2 != 0) {
          pcVar5 = "vol";
          uVar4 = 0x1a5;
          goto LAB_001ec032;
        }
      }
      else {
        uVar2 = ref_node_tri_area(ref_node,nodes,&volume);
        if (uVar2 != 0) {
          pcVar5 = "area";
          uVar4 = 0x1a3;
LAB_001ec032:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,uVar4,"ref_validation_cell_volume",(ulong)uVar2,pcVar5);
          return uVar2;
        }
      }
      if (volume <= 0.0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1ac,"ref_validation_cell_volume","negative volume tet");
        printf("cell %d volume %e\n",volume,(ulong)cell);
        for (lVar6 = 0; lVar6 < ref_cell->node_per; lVar6 = lVar6 + 1) {
          ref_node_location(ref_node,nodes[lVar6]);
        }
        return 1;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}